

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterYs<int> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterYRef *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  ImDrawIdx IVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  iVar16 = *(int *)((long)pGVar6->Ys +
                   (long)(((prim + pGVar6->Offset) % iVar16 + iVar16) % iVar16) *
                   (long)pGVar6->Stride);
  dVar19 = log10((pGVar6->XScale * (double)prim + pGVar6->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar15 = GImPlot;
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = (pIVar8->XAxis).Range.Min;
  iVar3 = pTVar7->YAxis;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  IVar2 = pIVar14->PixelRange[iVar3].Min;
  fVar22 = (float)(pIVar14->My[iVar3] * ((double)iVar16 - pIVar8->YAxis[iVar3].Range.Min) +
                  (double)IVar2.y);
  fVar23 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar19 / pIVar14->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar9->YRef;
  dVar20 = log10(((double)prim * pGVar9->XScale + pGVar9->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar19 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar7->YAxis;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar18 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar20 / pIVar15->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar19) + dVar19) - dVar19) + (double)IVar2.x);
  fVar21 = (float)(pIVar15->My[iVar16] * (dVar1 - pIVar8->YAxis[iVar16].Range.Min) + (double)IVar2.y
                  );
  auVar27._0_4_ = ~-(uint)(fVar18 <= fVar23) & (uint)fVar18;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar22) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar23 < fVar18) & (uint)fVar18;
  auVar27._12_4_ = ~-(uint)(fVar22 < fVar21) & (uint)fVar21;
  auVar12._4_4_ = (uint)fVar22 & -(uint)(fVar21 <= fVar22);
  auVar12._0_4_ = (uint)fVar23 & -(uint)(fVar18 <= fVar23);
  auVar12._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar18);
  auVar12._12_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar21);
  auVar27 = auVar27 | auVar12;
  fVar24 = (cull_rect->Min).y;
  auVar29._4_4_ = -(uint)(fVar24 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar13._4_8_ = auVar27._8_8_;
  auVar13._0_4_ = -(uint)(auVar27._4_4_ < fVar24);
  auVar28._0_8_ = auVar13._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._8_8_ = auVar28._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar29);
  if (iVar16 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar24 = fVar18 - fVar23;
    fVar25 = fVar21 - fVar22;
    fVar26 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar24 = fVar24 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar24 = fVar26 * fVar24;
    fVar26 = fVar26 * fVar25;
    (pIVar10->pos).x = fVar26 + fVar23;
    (pIVar10->pos).y = fVar22 - fVar24;
    (pIVar10->uv).x = IVar2.x;
    (pIVar10->uv).y = IVar2.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar4;
    pIVar10[1].pos.x = fVar26 + fVar18;
    pIVar10[1].pos.y = fVar21 - fVar24;
    pIVar10[1].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar4;
    pIVar10[2].pos.x = fVar18 - fVar26;
    pIVar10[2].pos.y = fVar21 + fVar24;
    pIVar10[2].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar4;
    pIVar10[3].pos.x = fVar23 - fVar26;
    pIVar10[3].pos.y = fVar24 + fVar22;
    pIVar10[3].uv = IVar2;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar5;
    *pIVar11 = IVar17;
    pIVar11[1] = IVar17 + 1;
    pIVar11[2] = IVar17 + 2;
    pIVar11[3] = IVar17;
    pIVar11[4] = IVar17 + 2;
    pIVar11[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }